

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

void __thiscall
cs::compiler_type::opt_expr
          (compiler_type *this,tree_type<cs::token_base_*> *tree,iterator it,optm_type do_optm)

{
  tree_type<cs::token_base_*> *ptVar1;
  char *pcVar2;
  token_base *ptVar3;
  _Elt_pointer paVar4;
  proxy *ppVar5;
  bool bVar6;
  slot_type *psVar7;
  slot_type *psVar8;
  slot_type *psVar9;
  bool bVar10;
  int iVar11;
  token_base **pptVar12;
  long lVar13;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *pdVar14;
  token_base *ptVar15;
  undefined *puVar16;
  iterator iVar17;
  token_value *ptVar18;
  undefined4 extraout_var;
  shared_ptr<cs::name_space> *psVar19;
  bool *pbVar20;
  callable *pcVar21;
  size_type sVar22;
  undefined4 extraout_var_00;
  object_method *poVar23;
  domain_type *pdVar24;
  compile_error *pcVar25;
  optm_type oVar26;
  _Elt_pointer paVar27;
  _func_int **pp_Var28;
  tree_type<cs::token_base_*> *tree_1;
  slot_type *psVar29;
  undefined8 uVar30;
  _Any_data *this_00;
  tree_type<cs::token_base_*> *ptVar31;
  domain_type *pdVar32;
  _Map_pointer ppaVar33;
  _func_int **pp_Var34;
  any *it_1;
  _Elt_pointer paVar35;
  any *it_2;
  tree_type<cs::token_base_*> *tree_00;
  size_t sVar36;
  slot_type **ppsVar37;
  initializer_list<cs_impl::any> __l;
  tree_type<cs::token_base_*> ltree;
  vector args;
  iterator local_e8;
  _Any_data local_e0;
  _func_int **local_d0;
  any local_c8;
  slot_type *local_c0;
  _Any_data local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  slot_type *local_98;
  slot_type **ppsStack_90;
  slot_type *local_88;
  undefined8 uStack_80;
  aligned_type *local_78;
  size_t sStack_70;
  domain_type *local_60;
  _func_int **local_58;
  aligned_type *local_50;
  _func_int *local_48;
  any local_40;
  
  local_d0 = (_func_int **)CONCAT44(local_d0._4_4_,do_optm);
  if (it.mData == (tree_node *)0x0) {
    return;
  }
  local_e8.mData = it.mData;
  local_e0._8_8_ = this;
  pptVar12 = tree_type<cs::token_base_*>::iterator::data(&local_e8);
  ptVar15 = *pptVar12;
  if (ptVar15 == (token_base *)0x0) {
    return;
  }
  iVar11 = (*ptVar15->_vptr_token_base[2])(ptVar15);
  uVar30 = local_e0._8_8_;
  switch(iVar11) {
  case 3:
    iVar11 = *(int *)&ptVar15[1]._vptr_token_base;
    if (0x26 < iVar11) {
      switch(iVar11) {
      case 0x27:
        iVar17 = tree_type<cs::token_base_*>::iterator::left(&local_e8);
        uVar30 = local_e0._8_8_;
        oVar26 = (optm_type)local_d0;
        opt_expr((compiler_type *)local_e0._8_8_,tree,iVar17,(optm_type)local_d0);
        iVar17 = tree_type<cs::token_base_*>::iterator::right(&local_e8);
        opt_expr((compiler_type *)uVar30,tree,iVar17,oVar26);
        local_b8._M_unused._0_8_ =
             (undefined8)tree_type<cs::token_base_*>::iterator::left(&local_e8);
        pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_b8);
        ptVar15 = *pptVar12;
        local_b8._M_unused._0_8_ =
             (undefined8)tree_type<cs::token_base_*>::iterator::right(&local_e8);
        pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_b8);
        if (((ptVar15 == (token_base *)0x0) || (ptVar3 = *pptVar12, ptVar3 == (token_base *)0x0)) ||
           (iVar11 = (*ptVar3->_vptr_token_base[2])(ptVar3), iVar11 != 0xd)) {
          pcVar25 = (compile_error *)__cxa_allocate_exception(0x28);
          local_b8._M_unused._M_object = &local_a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,"Wrong syntax for function call.","");
          compile_error::compile_error(pcVar25,(string *)&local_b8);
          __cxa_throw(pcVar25,&compile_error::typeinfo,compile_error::~compile_error);
        }
        iVar11 = (*ptVar15->_vptr_token_base[2])(ptVar15);
        if (iVar11 != 7) {
          return;
        }
        if (ptVar15[1]._vptr_token_base == (_func_int **)0x0) {
          puVar16 = &void::typeinfo;
        }
        else {
          puVar16 = (undefined *)(**(code **)(*(long *)ptVar15[1]._vptr_token_base[2] + 0x10))();
        }
        pdVar24 = (domain_type *)(ptVar15 + 1);
        pcVar2 = *(char **)(puVar16 + 8);
        local_60 = pdVar24;
        if (((pcVar2 == "N2cs8callableE") ||
            ((*pcVar2 != '*' && (iVar11 = strcmp(pcVar2,"N2cs8callableE"), iVar11 == 0)))) &&
           (pcVar21 = cs_impl::any::const_val<cs::callable>((any *)pdVar24),
           pcVar21->mType == request_fold)) {
          pp_Var28 = ptVar3[2]._vptr_token_base;
          local_d0 = ptVar3[4]._vptr_token_base;
          if (pp_Var28 != local_d0) {
            pp_Var34 = ptVar3[3]._vptr_token_base;
            sVar36 = ptVar3[3].line_num;
            do {
              local_b8._M_unused._M_object = *pp_Var28;
              pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_b8);
              ptVar15 = *pptVar12;
              if ((ptVar15 == (token_base *)0x0) ||
                 (iVar11 = (*ptVar15->_vptr_token_base[2])(ptVar15), iVar11 != 6)) {
                local_b8._M_unused._M_object = *pp_Var28;
              }
              else {
                local_b8._M_unused._M_object = ptVar15[1]._vptr_token_base;
              }
              bVar10 = optimizable((compiler_type *)local_e0._8_8_,(iterator *)&local_b8);
              if (!bVar10) {
                return;
              }
              pp_Var28 = pp_Var28 + 1;
              if (pp_Var28 == pp_Var34) {
                pp_Var28 = *(_func_int ***)(sVar36 + 8);
                sVar36 = sVar36 + 8;
                pp_Var34 = pp_Var28 + 0x40;
              }
            } while (pp_Var28 != local_d0);
          }
          pptVar12 = tree_type<cs::token_base_*>::iterator::data(&local_e8);
          local_50 = (aligned_type *)*pptVar12;
          local_b8._M_unused._M_object = (tree_node *)0x0;
          local_b8._8_8_ = 0;
          local_a8._M_allocated_capacity = 0;
          sVar22 = std::
                   deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                   ::size((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                           *)(ptVar3 + 1));
          std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::reserve
                    ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)&local_b8,sVar22);
          pp_Var28 = ptVar3[2]._vptr_token_base;
          local_58 = ptVar3[4]._vptr_token_base;
          if (pp_Var28 != local_58) {
            local_d0 = ptVar3[3]._vptr_token_base;
            local_c0 = (slot_type *)ptVar3[3].line_num;
            do {
              local_e0._M_unused._M_object = *pp_Var28;
              pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_e0);
              ptVar15 = *pptVar12;
              if ((ptVar15 == (token_base *)0x0) ||
                 (iVar11 = (*ptVar15->_vptr_token_base[2])(ptVar15), iVar11 != 6)) {
                local_48 = *pp_Var28;
                runtime_type::parse_expr
                          ((runtime_type *)&local_c8,
                           (iterator *)
                           (((((context_t *)(local_e0._8_8_ + 0x20))->
                             super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr)->instance).
                           super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           SUB81(&local_48,0));
                lvalue((var *)&local_c8);
                std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                          ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)&local_b8,
                           (any *)&local_e0);
                cs_impl::any::recycle((any *)&local_e0);
                cs_impl::any::recycle(&local_c8);
              }
              else {
                local_c8.mDat = (proxy *)ptVar15[1]._vptr_token_base;
                runtime_type::parse_expr
                          ((runtime_type *)&local_e0,
                           (iterator *)
                           (((((context_t *)(local_e0._8_8_ + 0x20))->
                             super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr)->instance).
                           super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           SUB81(&local_c8,0));
                pdVar14 = cs_impl::any::
                          const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
                                    ((any *)&local_e0);
                cs_impl::any::recycle((any *)&local_e0);
                paVar35 = (pdVar14->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                          _M_impl.super__Deque_impl_data._M_start._M_cur;
                paVar4 = (pdVar14->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                         _M_impl.super__Deque_impl_data._M_finish._M_cur;
                if (paVar35 != paVar4) {
                  paVar27 = (pdVar14->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>
                            )._M_impl.super__Deque_impl_data._M_start._M_last;
                  ppaVar33 = (pdVar14->
                             super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                             .super__Deque_impl_data._M_start._M_node;
                  do {
                    lvalue(paVar35);
                    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::
                    emplace_back<cs_impl::any>
                              ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)&local_b8,
                               (any *)&local_e0);
                    cs_impl::any::recycle((any *)&local_e0);
                    paVar35 = paVar35 + 1;
                    if (paVar35 == paVar27) {
                      paVar35 = ppaVar33[1];
                      ppaVar33 = ppaVar33 + 1;
                      paVar27 = paVar35 + 0x40;
                    }
                  } while (paVar35 != paVar4);
                }
              }
              pp_Var28 = pp_Var28 + 1;
              if (pp_Var28 == local_d0) {
                pp_Var28 = *(_func_int ***)((long)local_c0 + 8);
                local_c0 = (slot_type *)&(local_c0->value).first._M_string_length;
                local_d0 = pp_Var28 + 0x40;
              }
            } while (pp_Var28 != local_58);
          }
          pcVar21 = cs_impl::any::const_val<cs::callable>((any *)local_60);
          uVar30 = local_e0._8_8_;
          if ((pcVar21->mFunc).super__Function_base._M_manager == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          (*(pcVar21->mFunc)._M_invoker)
                    (&local_e0,(vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)pcVar21);
          ptVar18 = new_value((compiler_type *)uVar30,(var *)&local_e0);
          pptVar12 = tree_type<cs::token_base_*>::iterator::data(&local_e8);
        }
        else {
          ppVar5 = (proxy *)(pdVar24->m_reflect).
                            super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                            .
                            super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                            .ctrl_;
          if (ppVar5 == (proxy *)0x0) {
            puVar16 = &void::typeinfo;
          }
          else {
            iVar11 = (*ppVar5->data->_vptr_baseHolder[2])();
            puVar16 = (undefined *)CONCAT44(extraout_var_00,iVar11);
          }
          pcVar2 = *(char **)(puVar16 + 8);
          if (pcVar2 != "N2cs13object_methodE") {
            if (*pcVar2 == '*') {
              return;
            }
            iVar11 = strcmp(pcVar2,"N2cs13object_methodE");
            if (iVar11 != 0) {
              return;
            }
          }
          poVar23 = cs_impl::any::const_val<cs::object_method>((any *)local_60);
          if (poVar23->is_request_fold != true) {
            return;
          }
          pp_Var28 = ptVar3[2]._vptr_token_base;
          local_d0 = ptVar3[4]._vptr_token_base;
          if (pp_Var28 != local_d0) {
            pp_Var34 = ptVar3[3]._vptr_token_base;
            sVar36 = ptVar3[3].line_num;
            do {
              local_b8._M_unused._M_object = *pp_Var28;
              pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_b8);
              ptVar15 = *pptVar12;
              if ((ptVar15 == (token_base *)0x0) ||
                 (iVar11 = (*ptVar15->_vptr_token_base[2])(ptVar15), iVar11 != 6)) {
                local_b8._M_unused._M_object = *pp_Var28;
              }
              else {
                local_b8._M_unused._M_object = ptVar15[1]._vptr_token_base;
              }
              bVar10 = optimizable((compiler_type *)local_e0._8_8_,(iterator *)&local_b8);
              if (!bVar10) {
                return;
              }
              pp_Var28 = pp_Var28 + 1;
              if (pp_Var28 == pp_Var34) {
                pp_Var28 = *(_func_int ***)(sVar36 + 8);
                sVar36 = sVar36 + 8;
                pp_Var34 = pp_Var28 + 0x40;
              }
            } while (pp_Var28 != local_d0);
          }
          pptVar12 = tree_type<cs::token_base_*>::iterator::data(&local_e8);
          local_50 = (aligned_type *)*pptVar12;
          pdVar24 = (domain_type *)cs_impl::any::const_val<cs::object_method>((any *)local_60);
          local_e0._M_unused._M_object =
               (pdVar24->m_reflect).
               super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               .
               super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               .ctrl_;
          if ((tree_node *)local_e0._M_unused._0_8_ != (tree_node *)0x0) {
            ((tree_node *)local_e0._M_unused._0_8_)->left =
                 (tree_node *)((long)&((tree_node *)local_e0._M_unused._0_8_)->left->root + 1);
          }
          __l._M_len = 1;
          __l._M_array = (iterator)&local_e0;
          std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
                    ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)&local_b8,__l,
                     (allocator_type *)&local_c8);
          local_60 = pdVar24;
          cs_impl::any::recycle((any *)&local_e0);
          sVar22 = std::
                   deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                   ::size((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                           *)(ptVar3 + 1));
          std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::reserve
                    ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)&local_b8,sVar22);
          pp_Var28 = ptVar3[2]._vptr_token_base;
          local_58 = ptVar3[4]._vptr_token_base;
          if (pp_Var28 != local_58) {
            local_d0 = ptVar3[3]._vptr_token_base;
            local_c0 = (slot_type *)ptVar3[3].line_num;
            do {
              local_e0._M_unused._M_object = *pp_Var28;
              pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_e0);
              ptVar15 = *pptVar12;
              if ((ptVar15 == (token_base *)0x0) ||
                 (iVar11 = (*ptVar15->_vptr_token_base[2])(ptVar15), iVar11 != 6)) {
                local_48 = *pp_Var28;
                runtime_type::parse_expr
                          ((runtime_type *)&local_c8,
                           (iterator *)
                           (((((context_t *)(local_e0._8_8_ + 0x20))->
                             super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr)->instance).
                           super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           SUB81(&local_48,0));
                lvalue((var *)&local_c8);
                std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                          ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)&local_b8,
                           (any *)&local_e0);
                cs_impl::any::recycle((any *)&local_e0);
                cs_impl::any::recycle(&local_c8);
              }
              else {
                local_c8.mDat = (proxy *)ptVar15[1]._vptr_token_base;
                runtime_type::parse_expr
                          ((runtime_type *)&local_e0,
                           (iterator *)
                           (((((context_t *)(local_e0._8_8_ + 0x20))->
                             super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr)->instance).
                           super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           SUB81(&local_c8,0));
                pdVar14 = cs_impl::any::
                          const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
                                    ((any *)&local_e0);
                cs_impl::any::recycle((any *)&local_e0);
                paVar35 = (pdVar14->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                          _M_impl.super__Deque_impl_data._M_start._M_cur;
                paVar4 = (pdVar14->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                         _M_impl.super__Deque_impl_data._M_finish._M_cur;
                if (paVar35 != paVar4) {
                  paVar27 = (pdVar14->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>
                            )._M_impl.super__Deque_impl_data._M_start._M_last;
                  ppaVar33 = (pdVar14->
                             super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                             .super__Deque_impl_data._M_start._M_node;
                  do {
                    lvalue(paVar35);
                    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::
                    emplace_back<cs_impl::any>
                              ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)&local_b8,
                               (any *)&local_e0);
                    cs_impl::any::recycle((any *)&local_e0);
                    paVar35 = paVar35 + 1;
                    if (paVar35 == paVar27) {
                      paVar35 = ppaVar33[1];
                      ppaVar33 = ppaVar33 + 1;
                      paVar27 = paVar35 + 0x40;
                    }
                  } while (paVar35 != paVar4);
                }
              }
              pp_Var28 = pp_Var28 + 1;
              if (pp_Var28 == local_d0) {
                pp_Var28 = *(_func_int ***)((long)local_c0 + 8);
                local_c0 = (slot_type *)&(local_c0->value).first._M_string_length;
                local_d0 = pp_Var28 + 0x40;
              }
            } while (pp_Var28 != local_58);
          }
          pcVar21 = cs_impl::any::const_val<cs::callable>
                              ((any *)&(local_60->m_reflect).
                                       super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                       .
                                       super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                       .slots_);
          uVar30 = local_e0._8_8_;
          if ((pcVar21->mFunc).super__Function_base._M_manager == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          (*(pcVar21->mFunc)._M_invoker)
                    (&local_e0,(vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)pcVar21);
          ptVar18 = new_value((compiler_type *)uVar30,(var *)&local_e0);
          pptVar12 = tree_type<cs::token_base_*>::iterator::data(&local_e8);
        }
        *pptVar12 = &ptVar18->super_token_base;
        cs_impl::any::recycle((any *)&local_e0);
        std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector
                  ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)&local_b8);
        return;
      default:
        goto switchD_0012fc0d_caseD_5;
      case 0x2b:
        local_b8._M_unused._0_8_ =
             (undefined8)tree_type<cs::token_base_*>::iterator::left(&local_e8);
        pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_b8);
        if (*pptVar12 == (token_base *)0x0) {
          return;
        }
        pcVar25 = (compile_error *)__cxa_allocate_exception(0x28);
        local_b8._M_unused._M_object = &local_a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Wrong grammar for new expression.","");
        compile_error::compile_error(pcVar25,(string *)&local_b8);
        __cxa_throw(pcVar25,&compile_error::typeinfo,compile_error::~compile_error);
      case 0x2c:
        local_b8._M_unused._0_8_ =
             (undefined8)tree_type<cs::token_base_*>::iterator::left(&local_e8);
        pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_b8);
        if (*pptVar12 != (token_base *)0x0) {
          pcVar25 = (compile_error *)__cxa_allocate_exception(0x28);
          local_b8._M_unused._M_object = &local_a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,"Wrong grammar for gcnew expression.","");
          compile_error::compile_error(pcVar25,(string *)&local_b8);
          __cxa_throw(pcVar25,&compile_error::typeinfo,compile_error::~compile_error);
        }
        iVar17 = tree_type<cs::token_base_*>::iterator::right(&local_e8);
        uVar30 = local_e0._8_8_;
        break;
      case 0x2d:
        local_b8._M_unused._0_8_ =
             (undefined8)tree_type<cs::token_base_*>::iterator::left(&local_e8);
        pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_b8);
        if (*pptVar12 == (token_base *)0x0) {
LAB_00130d8d:
          pcVar25 = (compile_error *)__cxa_allocate_exception(0x28);
          local_b8._M_unused._M_object = &local_a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,"Wrong grammar for arrow expression.","");
          compile_error::compile_error(pcVar25,(string *)&local_b8);
          __cxa_throw(pcVar25,&compile_error::typeinfo,compile_error::~compile_error);
        }
        local_e0._M_unused._0_8_ =
             (undefined8)tree_type<cs::token_base_*>::iterator::right(&local_e8);
        pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_e0);
        if (*pptVar12 == (token_base *)0x0) goto LAB_00130d8d;
        local_c8.mDat = (proxy *)tree_type<cs::token_base_*>::iterator::right(&local_e8);
        pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_c8);
        iVar11 = (*(*pptVar12)->_vptr_token_base[2])();
        uVar30 = local_e0._8_8_;
        if (iVar11 != 4) goto LAB_00130d8d;
        iVar17 = tree_type<cs::token_base_*>::iterator::left(&local_e8);
      }
      goto LAB_00130441;
    }
    if (iVar11 == 0xe) {
      iVar17 = tree_type<cs::token_base_*>::iterator::left(&local_e8);
      iVar11 = tree_type<cs::token_base_*>::copy((EVP_PKEY_CTX *)iVar17.mData,(EVP_PKEY_CTX *)0x0);
      local_e0._M_unused._M_member_pointer = CONCAT44(extraout_var,iVar11);
      iVar17 = tree_type<cs::token_base_*>::iterator::left(&local_e8);
      uVar30 = local_e0._8_8_;
      opt_expr((compiler_type *)local_e0._8_8_,tree,iVar17,enable_namespace_optm);
      local_b8._M_unused._0_8_ = (undefined8)tree_type<cs::token_base_*>::iterator::left(&local_e8);
      pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_b8);
      ptVar15 = *pptVar12;
      local_b8._M_unused._0_8_ = (undefined8)tree_type<cs::token_base_*>::iterator::right(&local_e8)
      ;
      pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_b8);
      ptVar3 = *pptVar12;
      if ((ptVar3 != (token_base *)0x0) &&
         (iVar11 = (*ptVar3->_vptr_token_base[2])(ptVar3), iVar11 == 4)) {
        if ((ptVar15 != (token_base *)0x0) &&
           (iVar11 = (*ptVar15->_vptr_token_base[2])(ptVar15), iVar11 == 7)) {
          tree_type<cs::token_base_*>::iterator::data(&local_e8);
          runtime_type::parse_dot
                    ((runtime_type *)&local_b8,
                     (var *)(((((context_t *)(uVar30 + 0x20))->
                              super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->instance).
                            super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     ,ptVar15 + 1);
          if (((tree_node *)local_b8._M_unused._0_8_ != (tree_node *)0x0) &&
             (0 < *(short *)(local_b8._M_unused._M_function_pointer + 2))) {
            ptVar18 = new_value((compiler_type *)uVar30,(var *)&local_b8);
            pptVar12 = tree_type<cs::token_base_*>::iterator::data(&local_e8);
            *pptVar12 = &ptVar18->super_token_base;
          }
          cs_impl::any::recycle((any *)&local_b8);
        }
        tree_type<cs::token_base_*>::destroy((tree_node *)local_e0._M_unused._0_8_);
        return;
      }
      pcVar25 = (compile_error *)__cxa_allocate_exception(0x28);
      local_b8._M_unused._M_object = &local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"Wrong grammar for dot expression.","");
      compile_error::compile_error(pcVar25,(string *)&local_b8);
      __cxa_throw(pcVar25,&compile_error::typeinfo,compile_error::~compile_error);
    }
    if (iVar11 != 0x11) {
      if (iVar11 == 0x1d) {
        local_b8._M_unused._0_8_ =
             (undefined8)tree_type<cs::token_base_*>::iterator::right(&local_e8);
        pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_b8);
        uVar30 = local_e0._8_8_;
        ptVar15 = *pptVar12;
        if ((ptVar15 == (token_base *)0x0) ||
           (ptVar15->_vptr_token_base != (_func_int **)&PTR__token_base_0025dd80)) {
          ptVar15 = (token_base *)0x0;
        }
        if ((ptVar15 == (token_base *)0x0) || (*(int *)&ptVar15[1]._vptr_token_base != 0x1c)) {
          pcVar25 = (compile_error *)__cxa_allocate_exception(0x28);
          local_b8._M_unused._M_object = &local_a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,"Wrong grammar for choice expression.","");
          compile_error::compile_error(pcVar25,(string *)&local_b8);
          __cxa_throw(pcVar25,&compile_error::typeinfo,compile_error::~compile_error);
        }
        iVar17 = tree_type<cs::token_base_*>::iterator::left(&local_e8);
        oVar26 = (optm_type)local_d0;
        opt_expr((compiler_type *)uVar30,tree,iVar17,(optm_type)local_d0);
        local_b8._M_unused._0_8_ =
             (undefined8)tree_type<cs::token_base_*>::iterator::right(&local_e8);
        iVar17 = tree_type<cs::token_base_*>::iterator::left((iterator *)&local_b8);
        opt_expr((compiler_type *)uVar30,tree,iVar17,oVar26);
        local_b8._M_unused._0_8_ =
             (undefined8)tree_type<cs::token_base_*>::iterator::right(&local_e8);
        iVar17 = tree_type<cs::token_base_*>::iterator::right((iterator *)&local_b8);
        opt_expr((compiler_type *)uVar30,tree,iVar17,oVar26);
        local_b8._M_unused._0_8_ =
             (undefined8)tree_type<cs::token_base_*>::iterator::left(&local_e8);
        pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_b8);
        ptVar15 = *pptVar12;
        if ((ptVar15 == (token_base *)0x0) ||
           (ptVar15->_vptr_token_base != (_func_int **)&PTR__token_value_0025ddb8)) {
          ptVar15 = (token_base *)0x0;
        }
        if (ptVar15 == (token_base *)0x0) {
          return;
        }
        if (ptVar15[1]._vptr_token_base == (_func_int **)0x0) {
          puVar16 = &void::typeinfo;
        }
        else {
          puVar16 = (undefined *)(**(code **)(*(long *)ptVar15[1]._vptr_token_base[2] + 0x10))();
        }
        pcVar2 = *(char **)(puVar16 + 8);
        if ((pcVar2 != std::ios_base::out) &&
           ((*pcVar2 == '*' || (iVar11 = strcmp(pcVar2,std::ios_base::out), iVar11 != 0)))) {
          pcVar25 = (compile_error *)__cxa_allocate_exception(0x28);
          local_b8._M_unused._M_object = &local_a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,"Choice condition must be boolean.","");
          compile_error::compile_error(pcVar25,(string *)&local_b8);
          __cxa_throw(pcVar25,&compile_error::typeinfo,compile_error::~compile_error);
        }
        pbVar20 = cs_impl::any::const_val<bool>((any *)(ptVar15 + 1));
        bVar10 = *pbVar20;
        iVar17 = tree_type<cs::token_base_*>::iterator::right(&local_e8);
        if (bVar10 == true) {
          tree_type<cs::token_base_*>::reserve_left(tree,iVar17);
        }
        else {
          tree_type<cs::token_base_*>::reserve_right(tree,iVar17);
        }
        tree_type<cs::token_base_*>::reserve_right(tree,local_e8);
        return;
      }
      goto switchD_0012fc0d_caseD_5;
    }
    local_b8._M_unused._0_8_ = (undefined8)tree_type<cs::token_base_*>::iterator::left(&local_e8);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_b8);
    if (*pptVar12 == (token_base *)0x0) {
LAB_00130e8f:
      pcVar25 = (compile_error *)__cxa_allocate_exception(0x28);
      local_b8._M_unused._M_object = &local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"Wrong grammar for assign expression.","");
      compile_error::compile_error(pcVar25,(string *)&local_b8);
      __cxa_throw(pcVar25,&compile_error::typeinfo,compile_error::~compile_error);
    }
    local_e0._M_unused._0_8_ = (undefined8)tree_type<cs::token_base_*>::iterator::right(&local_e8);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_e0);
    uVar30 = local_e0._8_8_;
    if (*pptVar12 == (token_base *)0x0) goto LAB_00130e8f;
    iVar17 = tree_type<cs::token_base_*>::iterator::left(&local_e8);
    oVar26 = (optm_type)local_d0;
    opt_expr((compiler_type *)uVar30,tree,iVar17,(optm_type)local_d0);
    iVar17 = tree_type<cs::token_base_*>::iterator::right(&local_e8);
    goto LAB_00130445;
  case 4:
    domain_manager::get_var_optimizable<cs::var_id_const&>
              ((domain_manager *)&local_e0,
               (var_id *)
               &(((((((context_t *)(local_e0._8_8_ + 0x20))->
                    super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->super_runtime_type).storage);
    if (((tree_node *)local_e0._M_unused._0_8_ != (tree_node *)0x0) &&
       (0 < *(short *)(local_e0._M_unused._M_function_pointer + 2))) {
      bVar10 = true;
      if ((optm_type)local_d0 == 1) {
LAB_0012fddc:
        bVar6 = false;
      }
      else {
        lVar13 = (*(code *)(*(tree_node **)(local_e0._M_unused._M_function_pointer + 0x10))->root->
                           right)();
        pcVar2 = *(char **)(lVar13 + 8);
        if ((pcVar2 != "St10shared_ptrIN2cs10name_spaceEE") &&
           ((*pcVar2 == '*' ||
            (iVar11 = strcmp(pcVar2,"St10shared_ptrIN2cs10name_spaceEE"), iVar11 != 0))))
        goto LAB_0012fddc;
        psVar19 = cs_impl::any::const_val<std::shared_ptr<cs::name_space>>((any *)&local_e0);
        pdVar24 = ((psVar19->super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->m_data;
        local_b8._M_unused._M_object = &local_a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"__PRAGMA_CS_NAMESPACE_DEFINITION__","");
        bVar10 = domain_type::exist(pdVar24,(string *)&local_b8);
        bVar10 = !bVar10;
        bVar6 = true;
      }
      if ((bVar6) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_unused._0_8_ != &local_a8)) {
        operator_delete(local_b8._M_unused._M_object,local_a8._M_allocated_capacity + 1);
      }
      if (bVar10) {
        ptVar18 = new_value((compiler_type *)uVar30,(var *)&local_e0);
        pptVar12 = tree_type<cs::token_base_*>::iterator::data(&local_e8);
        *pptVar12 = &ptVar18->super_token_base;
      }
    }
    this_00 = &local_e0;
    goto LAB_001306cf;
  default:
switchD_0012fc0d_caseD_5:
    iVar17 = tree_type<cs::token_base_*>::iterator::left(&local_e8);
    uVar30 = local_e0._8_8_;
    oVar26 = (optm_type)local_d0;
    opt_expr((compiler_type *)local_e0._8_8_,tree,iVar17,(optm_type)local_d0);
    iVar17 = tree_type<cs::token_base_*>::iterator::right(&local_e8);
    opt_expr((compiler_type *)uVar30,tree,iVar17,oVar26);
    local_b8._M_unused._0_8_ = (undefined8)tree_type<cs::token_base_*>::iterator::left(&local_e8);
    bVar10 = optimizable((compiler_type *)uVar30,(iterator *)&local_b8);
    if (bVar10) {
      local_e0._M_unused._0_8_ = (undefined8)tree_type<cs::token_base_*>::iterator::right(&local_e8)
      ;
      bVar10 = optimizable((compiler_type *)uVar30,(iterator *)&local_e0);
      if (bVar10) {
        tree_type<cs::token_base_*>::iterator::data(&local_e8);
        uVar30 = local_e0._8_8_;
        runtime_type::parse_expr
                  ((runtime_type *)&local_b8,
                   (iterator *)
                   (((((context_t *)(local_e0._8_8_ + 0x20))->
                     super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                   instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,SUB81(&local_e8,0));
        ptVar18 = new_value((compiler_type *)uVar30,(var *)&local_b8);
        cs_impl::any::recycle((any *)&local_b8);
        tree_type<cs::token_base_*>::erase_left(tree,local_e8);
        tree_type<cs::token_base_*>::erase_right(tree,local_e8);
        pptVar12 = tree_type<cs::token_base_*>::iterator::data(&local_e8);
        *pptVar12 = &ptVar18->super_token_base;
      }
    }
    break;
  case 6:
    iVar17.mData = (tree_node *)ptVar15[1]._vptr_token_base;
    tree = (tree_type<cs::token_base_*> *)(ptVar15 + 1);
LAB_00130441:
    oVar26 = (optm_type)local_d0;
LAB_00130445:
    opt_expr((compiler_type *)uVar30,tree,iVar17,oVar26);
    break;
  case 8:
    tree_type<cs::token_base_*>::iterator::data(&local_e8);
    uVar30 = local_e0._8_8_;
    runtime_type::get_string_literal
              ((runtime_type *)&local_b8,
               (string *)
               (((((context_t *)(local_e0._8_8_ + 0x20))->
                 super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->instance
               ).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (string *)(ptVar15 + 1));
    ptVar18 = new_value((compiler_type *)uVar30,(var *)&local_b8);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data(&local_e8);
    *pptVar12 = &ptVar18->super_token_base;
    this_00 = &local_b8;
LAB_001306cf:
    cs_impl::any::recycle((any *)this_00);
    break;
  case 0xe:
    pdVar24 = (domain_type *)ptVar15[2]._vptr_token_base;
    pdVar32 = (domain_type *)ptVar15[4]._vptr_token_base;
    if (pdVar24 != pdVar32) {
      local_58 = ptVar15[3]._vptr_token_base;
      psVar29 = (slot_type *)ptVar15[3].line_num;
      local_60 = pdVar32;
      do {
        local_b8._M_unused._M_object =
             (pdVar24->m_reflect).
             super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .
             super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .ctrl_;
        pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_b8);
        ptVar3 = *pptVar12;
        if ((ptVar3 == (token_base *)0x0) ||
           (iVar11 = (*ptVar3->_vptr_token_base[2])(ptVar3), uVar30 = local_e0._8_8_, iVar11 != 6))
        {
          uVar30 = local_e0._8_8_;
          optimize_expression((compiler_type *)local_e0._8_8_,(tree_type<cs::token_base_*> *)pdVar24
                              ,(optm_type)local_d0);
          local_b8._M_unused._M_object =
               (pdVar24->m_reflect).
               super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               .
               super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               .ctrl_;
        }
        else {
          local_c0 = psVar29;
          optimize_expression((compiler_type *)local_e0._8_8_,
                              (tree_type<cs::token_base_*> *)(ptVar3 + 1),(optm_type)local_d0);
          local_b8._M_unused._M_object = ptVar3[1]._vptr_token_base;
          psVar29 = local_c0;
          pdVar32 = local_60;
        }
        bVar10 = optimizable((compiler_type *)uVar30,(iterator *)&local_b8);
        if (!bVar10) {
          return;
        }
        pdVar24 = (domain_type *)
                  &(pdVar24->m_reflect).
                   super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   .
                   super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   .slots_;
        if (pdVar24 == (domain_type *)local_58) {
          pdVar24 = *(domain_type **)((long)psVar29 + 8);
          psVar29 = (slot_type *)&(psVar29->value).first._M_string_length;
          local_58 = (_func_int **)
                     &pdVar24[5].m_reflect.
                      super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      .
                      super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      .field_0x20;
        }
      } while (pdVar24 != pdVar32);
    }
    pptVar12 = tree_type<cs::token_base_*>::iterator::data(&local_e8);
    local_60 = (domain_type *)*pptVar12;
    local_78 = (aligned_type *)0x0;
    sStack_70 = 0;
    local_88 = (slot_type *)0x0;
    uStack_80 = 0;
    local_98 = (slot_type *)0x0;
    ppsStack_90 = (slot_type **)0x0;
    local_a8._M_allocated_capacity = 0;
    local_a8._8_8_ = 0;
    local_b8._M_unused._M_object = (void *)0x0;
    local_b8._8_8_ = 0;
    std::_Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>::_M_initialize_map
              ((_Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_> *)&local_b8,0);
    pp_Var28 = ptVar15[2]._vptr_token_base;
    local_58 = ptVar15[4]._vptr_token_base;
    uVar30 = local_a8._M_allocated_capacity;
    psVar7 = local_98;
    ppsVar37 = ppsStack_90;
    psVar8 = local_88;
    psVar9 = local_88;
    if (pp_Var28 != local_58) {
      local_d0 = ptVar15[3]._vptr_token_base;
      local_c0 = (slot_type *)ptVar15[3].line_num;
      do {
        uVar30 = local_e0._8_8_;
        local_e0._M_unused._M_object = *pp_Var28;
        pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_e0);
        ptVar15 = *pptVar12;
        if ((ptVar15 == (token_base *)0x0) ||
           (iVar11 = (*ptVar15->_vptr_token_base[2])(ptVar15), iVar11 != 6)) {
          local_c8.mDat = (proxy *)*pp_Var28;
          runtime_type::parse_expr
                    ((runtime_type *)&stack0xffffffffffffffc8,
                     (iterator *)
                     (((((context_t *)(uVar30 + 0x20))->
                       super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                     instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,SUB81(&local_c8,0));
          copy((EVP_PKEY_CTX *)local_e0._M_pod_data,(EVP_PKEY_CTX *)&stack0xffffffffffffffc8);
          std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                    ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)&local_b8,
                     (any *)&local_e0);
          cs_impl::any::recycle((any *)&local_e0);
          cs_impl::any::recycle((any *)&stack0xffffffffffffffc8);
        }
        else {
          local_c8.mDat = (proxy *)ptVar15[1]._vptr_token_base;
          runtime_type::parse_expr
                    ((runtime_type *)&local_e0,
                     (iterator *)
                     (((((context_t *)(uVar30 + 0x20))->
                       super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                     instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,SUB81(&local_c8,0));
          pdVar14 = cs_impl::any::const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
                              ((any *)&local_e0);
          cs_impl::any::recycle((any *)&local_e0);
          paVar35 = (pdVar14->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          paVar4 = (pdVar14->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                   .super__Deque_impl_data._M_finish._M_cur;
          if (paVar35 != paVar4) {
            paVar27 = (pdVar14->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_start._M_last;
            ppaVar33 = (pdVar14->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                       _M_impl.super__Deque_impl_data._M_start._M_node;
            do {
              local_40.mDat = paVar35->mDat;
              if (local_40.mDat != (proxy *)0x0) {
                (local_40.mDat)->refcount = (local_40.mDat)->refcount + 1;
              }
              copy((EVP_PKEY_CTX *)local_e0._M_pod_data,(EVP_PKEY_CTX *)&local_40);
              std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                        ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)&local_b8,
                         (any *)&local_e0);
              cs_impl::any::recycle((any *)&local_e0);
              cs_impl::any::recycle(&local_40);
              paVar35 = paVar35 + 1;
              if (paVar35 == paVar27) {
                paVar35 = ppaVar33[1];
                ppaVar33 = ppaVar33 + 1;
                paVar27 = paVar35 + 0x40;
              }
            } while (paVar35 != paVar4);
          }
        }
        pp_Var28 = pp_Var28 + 1;
        if (pp_Var28 == local_d0) {
          pp_Var28 = *(_func_int ***)((long)local_c0 + 8);
          local_c0 = (slot_type *)&(local_c0->value).first._M_string_length;
          local_d0 = pp_Var28 + 0x40;
        }
        uVar30 = local_a8._M_allocated_capacity;
        psVar7 = local_98;
        ppsVar37 = ppsStack_90;
        psVar8 = local_88;
        psVar9 = local_88;
      } while (pp_Var28 != local_58);
    }
    while (local_88 = psVar9, psVar9 = local_88, (slot_type *)uVar30 != local_88) {
      local_88 = psVar8;
      add_constant((compiler_type *)local_e0._8_8_,(var *)uVar30);
      uVar30 = &((slot_type *)uVar30)->_M_string_length;
      psVar8 = local_88;
      if ((slot_type *)uVar30 == psVar7) {
        uVar30 = ppsVar37[1];
        ppsVar37 = ppsVar37 + 1;
        psVar7 = (slot_type *)(uVar30 + 0x200);
      }
    }
    local_88 = psVar8;
    cs_impl::any::
    make<std::deque<cs_impl::any,std::allocator<cs_impl::any>>,std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
              ((any *)&local_e0,(deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)&local_b8);
    ptVar18 = new_value((compiler_type *)local_e0._8_8_,(var *)&local_e0);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data(&local_e8);
    *pptVar12 = &ptVar18->super_token_base;
    cs_impl::any::recycle((any *)&local_e0);
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::~deque
              ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)&local_b8);
    break;
  case 0xf:
    tree_00 = (tree_type<cs::token_base_*> *)ptVar15[2]._vptr_token_base;
    ptVar1 = (tree_type<cs::token_base_*> *)ptVar15[4]._vptr_token_base;
    if (tree_00 != ptVar1) {
      ptVar31 = (tree_type<cs::token_base_*> *)ptVar15[3]._vptr_token_base;
      sVar36 = ptVar15[3].line_num;
      do {
        optimize_expression((compiler_type *)local_e0._8_8_,tree_00,(optm_type)local_d0);
        tree_00 = tree_00 + 1;
        if (tree_00 == ptVar31) {
          tree_00 = *(tree_type<cs::token_base_*> **)(sVar36 + 8);
          sVar36 = sVar36 + 8;
          ptVar31 = tree_00 + 0x40;
        }
      } while (tree_00 != ptVar1);
    }
  }
  return;
}

Assistant:

void
	compiler_type::opt_expr(tree_type<token_base *> &tree, tree_type<token_base *>::iterator it, optm_type do_optm)
	{
		if (!it.usable())
			return;
		token_base *token = it.data();
		if (token == nullptr)
			return;
		switch (token->get_type()) {
		default:
			break;
		case token_types::id: {
			var value = context->instance->storage.get_var_optimizable(static_cast<token_id *>(token)->get_id());
			if (value.usable() && value.is_protect()) {
				if (do_optm == optm_type::enable_namespace_optm || value.type() != typeid(namespace_t) ||
				        !value.const_val<namespace_t>()->get_domain().exist("__PRAGMA_CS_NAMESPACE_DEFINITION__"))
					it.data() = new_value(value);
			}
			return;
		}
		case token_types::literal: {
			token_literal *ptr = static_cast<token_literal *>(token);
			token_base *oldt = it.data();
			try {
				it.data() = new_value(context->instance->get_string_literal(ptr->get_data(), ptr->get_literal()));
			}
			catch (...) {
				it.data() = oldt;
			}
			return;
		}
		case token_types::expand: {
			tree_type<token_base *> &tree = static_cast<token_expand *>(token)->get_tree();
			opt_expr(tree, tree.root(), do_optm);
			return;
		}
		case token_types::array: {
			token_base *ptr = nullptr;
			for (auto &tree: static_cast<token_array *>(token)->get_array()) {
				ptr = tree.root().data();
				if (ptr != nullptr && ptr->get_type() == token_types::expand) {
					auto &child_tree = static_cast<token_expand *>(ptr)->get_tree();
					optimize_expression(child_tree, do_optm);
					if (!optimizable(child_tree.root()))
						return;
				}
				else {
					optimize_expression(tree, do_optm);
					if (!optimizable(tree.root()))
						return;
				}
			}
			token_base *oldt = it.data();
			try {
				array arr;
				for (auto &tree: static_cast<token_array *>(token)->get_array()) {
					ptr = tree.root().data();
					if (ptr != nullptr && ptr->get_type() == token_types::expand) {
						const auto &child_arr = context->instance->parse_expr(
						                            static_cast<token_expand *>(ptr)->get_tree().root()).const_val<array>();
						for (auto &it: child_arr)
							arr.push_back(copy(it));
					}
					else
						arr.push_back(copy(context->instance->parse_expr(tree.root())));
				}
				for (auto &it: arr)
					add_constant(it);
				it.data() = new_value(var::make<array>(std::move(arr)));
			}
			catch (...) {
				it.data() = oldt;
			}
			return;
		}
		case token_types::parallel: {
			for (auto &tree: static_cast<token_parallel *>(token)->get_parallel())
				optimize_expression(tree, do_optm);
			return;
		}
		case token_types::signal: {
			switch (static_cast<token_signal *>(token)->get_signal()) {
			default:
				break;
			case signal_types::new_:
				// Fix(2020-11-26): Terminate new expression optimization
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for new expression.");
				return;
			case signal_types::gcnew_:
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for gcnew expression.");
				opt_expr(tree, it.right(), do_optm);
				return;
			case signal_types::asi_:
				if (it.left().data() == nullptr || it.right().data() == nullptr)
					throw compile_error("Wrong grammar for assign expression.");
				opt_expr(tree, it.left(), do_optm);
				opt_expr(tree, it.right(), do_optm);
				return;
			case signal_types::choice_: {
				token_signal *sig = dynamic_cast<token_signal *>(it.right().data());
				if (sig == nullptr || sig->get_signal() != signal_types::pair_)
					throw compile_error("Wrong grammar for choice expression.");
				opt_expr(tree, it.left(), do_optm);
				opt_expr(tree, it.right().left(), do_optm);
				opt_expr(tree, it.right().right(), do_optm);
				token_value *val = dynamic_cast<token_value *>(it.left().data());
				if (val != nullptr) {
					if (val->get_value().type() == typeid(boolean)) {
						if (val->get_value().const_val<boolean>())
							tree.reserve_left(it.right());
						else
							tree.reserve_right(it.right());
						tree.reserve_right(it);
					}
					else
						throw compile_error("Choice condition must be boolean.");
				}
				return;
			}
			case signal_types::arrow_:
				if (it.left().data() == nullptr || it.right().data() == nullptr ||
				        it.right().data()->get_type() != token_types::id)
					throw compile_error("Wrong grammar for arrow expression.");
				opt_expr(tree, it.left(), do_optm);
				return;
			case signal_types::dot_: {
				tree_type<token_base *> ltree(it.left());
				opt_expr(tree, it.left(), optm_type::enable_namespace_optm);
				token_base *lptr = it.left().data();
				token_base *rptr = it.right().data();
				if (rptr == nullptr || rptr->get_type() != token_types::id)
					throw compile_error("Wrong grammar for dot expression.");
				if (lptr != nullptr && lptr->get_type() == token_types::value) {
					const var &a = static_cast<token_value *>(lptr)->get_value();
					token_base *orig_ptr = it.data();
					try {
						const var &v = context->instance->parse_dot(a, rptr);
						if (v.is_protect())
							it.data() = new_value(v);
					}
					catch (...) {
						// Fix(2020-12-05): Broken AST structure caused by tree_type::merge
						it.data() = orig_ptr;
						tree.merge(it.left(), ltree);
					}
				}
				return;
			}
			case signal_types::fcall_: {
				opt_expr(tree, it.left(), do_optm);
				opt_expr(tree, it.right(), do_optm);
				token_base *lptr = it.left().data();
				token_base *rptr = it.right().data();
				if (lptr == nullptr || rptr == nullptr || rptr->get_type() != token_types::arglist)
					throw compile_error("Wrong syntax for function call.");
				if (lptr->get_type() == token_types::value) {
					var &a = static_cast<token_value *>(lptr)->get_value();
					if (a.type() == typeid(callable) && a.const_val<callable>().is_request_fold()) {
						token_base *ptr = nullptr;
						for (auto &tree: static_cast<token_arglist *>(rptr)->get_arglist()) {
							ptr = tree.root().data();
							if (ptr != nullptr && ptr->get_type() == token_types::expand) {
								if (!optimizable(static_cast<token_expand *>(ptr)->get_tree().root()))
									return;
							}
							else {
								if (!optimizable(tree.root()))
									return;
							}
						}
						token_base *oldt = it.data();
						try {
							vector args;
							args.reserve(static_cast<token_arglist *>(rptr)->get_arglist().size());
							for (auto &tree: static_cast<token_arglist *>(rptr)->get_arglist()) {
								ptr = tree.root().data();
								if (ptr != nullptr && ptr->get_type() == token_types::expand) {
									const auto &arr = context->instance->parse_expr(
									                      static_cast<token_expand *>(ptr)->get_tree().root()).const_val<array>();
									for (auto &it: arr)
										args.push_back(lvalue(it));
								}
								else
									args.push_back(lvalue(context->instance->parse_expr(tree.root())));
							}
							it.data() = new_value(a.const_val<callable>().call(args));
						}
						catch (...) {
							it.data() = oldt;
						}
					}
					else if (a.type() == typeid(object_method) &&
					         a.const_val<object_method>().is_request_fold) {
						token_base *ptr = nullptr;
						for (auto &tree: static_cast<token_arglist *>(rptr)->get_arglist()) {
							ptr = tree.root().data();
							if (ptr != nullptr && ptr->get_type() == token_types::expand) {
								if (!optimizable(static_cast<token_expand *>(ptr)->get_tree().root()))
									return;
							}
							else {
								if (!optimizable(tree.root()))
									return;
							}
						}
						token_base *oldt = it.data();
						try {
							const auto &om = a.const_val<object_method>();
							vector args{om.object};
							args.reserve(static_cast<token_arglist *>(rptr)->get_arglist().size());
							for (auto &tree: static_cast<token_arglist *>(rptr)->get_arglist()) {
								ptr = tree.root().data();
								if (ptr != nullptr && ptr->get_type() == token_types::expand) {
									const auto &arr = context->instance->parse_expr(
									                      static_cast<token_expand *>(ptr)->get_tree().root()).const_val<array>();
									for (auto &it: arr)
										args.push_back(lvalue(it));
								}
								else
									args.push_back(lvalue(context->instance->parse_expr(tree.root())));
							}
							it.data() = new_value(om.callable.const_val<callable>().call(args));
						}
						catch (...) {
							it.data() = oldt;
						}
					}
				}
				return;
			}
			}
		}
		}
		opt_expr(tree, it.left(), do_optm);
		opt_expr(tree, it.right(), do_optm);
		if (optimizable(it.left()) && optimizable(it.right())) {
			token_base *oldt = it.data();
			try {
				token_value *token = new_value(context->instance->parse_expr(it));
				tree.
				erase_left(it);
				tree.
				erase_right(it);
				it.data() = token;
			}
			catch (...) {
				it.data() = oldt;
			}
		}
	}